

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_EnumerateCallbackResult
enumerateFromMountPoint
          (DirHandle *i,char *arcfname,PHYSFS_EnumerateCallback callback,char *_fname,void *data)

{
  char *pcVar1;
  undefined1 *ptr_00;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  undefined1 *puVar6;
  undefined1 auStack_88 [8];
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  char *mountPoint;
  size_t slen;
  char *end;
  char *ptr;
  size_t len;
  void *pvStack_38;
  PHYSFS_EnumerateCallbackResult retval;
  void *data_local;
  char *_fname_local;
  PHYSFS_EnumerateCallback callback_local;
  char *arcfname_local;
  DirHandle *i_local;
  
  puVar6 = auStack_88;
  pvStack_38 = data;
  data_local = _fname;
  _fname_local = (char *)callback;
  callback_local = (PHYSFS_EnumerateCallback)arcfname;
  arcfname_local = (char *)i;
  ptr = (char *)strlen(arcfname);
  end = (char *)0x0;
  slen = 0;
  sVar4 = strlen(*(char **)(arcfname_local + 0x10));
  pcVar5 = (char *)(sVar4 + 1);
  if (pcVar5 < (char *)0x100) {
    puVar6 = auStack_88 + -(sVar4 + 0x18 & 0xfffffffffffffff0);
    local_70 = puVar6;
  }
  else {
    local_70 = (undefined1 *)0x0;
  }
  ptr_00 = local_70;
  mountPoint = pcVar5;
  *(undefined8 *)(puVar6 + -8) = 0x10a0cb;
  pcVar5 = (char *)__PHYSFS_initSmallAlloc(ptr_00,(size_t)pcVar5);
  local_68 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    *(undefined8 *)(puVar6 + -8) = 0x10a0e0;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    i_local._4_4_ = PHYSFS_ENUM_ERROR;
  }
  else {
    pcVar1 = *(char **)(arcfname_local + 0x10);
    *(undefined8 *)(puVar6 + -8) = 0x10a0ff;
    strcpy(pcVar5,pcVar1);
    local_78 = local_68;
    if (ptr == (char *)0x0) {
      local_80 = (char *)0x0;
    }
    else {
      local_80 = ptr + 1;
    }
    pcVar5 = local_68 + (long)local_80;
    end = pcVar5;
    *(undefined8 *)(puVar6 + -8) = 0x10a141;
    slen = (size_t)strchr(pcVar5,0x2f);
    pcVar1 = _fname_local;
    pvVar3 = data_local;
    pvVar2 = pvStack_38;
    pcVar5 = end;
    if ((char *)slen == (char *)0x0) {
      *(undefined8 *)(puVar6 + -8) = 0x10a16d;
      __assert_fail("end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs.c"
                    ,0x922,
                    "PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *, const char *, PHYSFS_EnumerateCallback, const char *, void *)"
                   );
    }
    *(char *)slen = '\0';
    *(undefined8 *)(puVar6 + -8) = 0x10a186;
    len._4_4_ = (*(code *)pcVar1)(pvVar2,pvVar3,pcVar5);
    pcVar5 = local_68;
    *(undefined8 *)(puVar6 + -8) = 0x10a192;
    __PHYSFS_smallFree(pcVar5);
    if (len._4_4_ == PHYSFS_ENUM_ERROR) {
      *(undefined8 *)(puVar6 + -8) = 0x10a1a2;
      PHYSFS_setErrorCode(PHYSFS_ERR_APP_CALLBACK);
      i_local._4_4_ = len._4_4_;
    }
    else {
      i_local._4_4_ = len._4_4_;
    }
  }
  return i_local._4_4_;
}

Assistant:

static PHYSFS_EnumerateCallbackResult enumerateFromMountPoint(DirHandle *i,
                                    const char *arcfname,
                                    PHYSFS_EnumerateCallback callback,
                                    const char *_fname, void *data)
{
    PHYSFS_EnumerateCallbackResult retval;
    const size_t len = strlen(arcfname);
    char *ptr = NULL;
    char *end = NULL;
    const size_t slen = strlen(i->mountPoint) + 1;
    char *mountPoint = (char *) __PHYSFS_smallAlloc(slen);

    BAIL_IF(!mountPoint, PHYSFS_ERR_OUT_OF_MEMORY, PHYSFS_ENUM_ERROR);

    strcpy(mountPoint, i->mountPoint);
    ptr = mountPoint + ((len) ? len + 1 : 0);
    end = strchr(ptr, '/');
    assert(end);  /* should always find a terminating '/'. */
    *end = '\0';
    retval = callback(data, _fname, ptr);
    __PHYSFS_smallFree(mountPoint);

    BAIL_IF(retval == PHYSFS_ENUM_ERROR, PHYSFS_ERR_APP_CALLBACK, retval);
    return retval;
}